

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,Terminator *term,void *data)

{
  int iVar1;
  LocalNameInfo *pLVar2;
  int *in_RDX;
  long in_RSI;
  CodeGenerateVisitor *in_RDI;
  Instruction instruction_9;
  int expect_results;
  Instruction instruction_8;
  Instruction instruction_7;
  int bvalue;
  Instruction instruction_6;
  int index_4;
  Instruction instruction_5;
  LocalNameInfo *local_res48;
  Instruction instruction_4;
  int index_3;
  Instruction instruction_3;
  int index_2;
  Instruction instruction_2;
  int index_1;
  Instruction instruction_1;
  LocalNameInfo *local;
  Instruction instruction;
  int index;
  Function *function;
  int end_register;
  int register_id;
  ExpVarData_conflict *exp_var_data;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  OpType op;
  int iVar3;
  int in_stack_ffffffffffffff48;
  Instruction in_stack_ffffffffffffff4c;
  Instruction in_stack_ffffffffffffff50;
  Instruction in_stack_ffffffffffffff54;
  
  iVar3 = *in_RDX;
  iVar1 = in_RDX[1];
  GetCurrentFunction(in_RDI);
  if (*(int *)(in_RSI + 0x28) == 2) {
    if (*(int *)(in_RSI + 0x20) != 0x115) {
      __assert_fail("term->token_.token_ == Token_Id",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                    ,0x4c5,"virtual void luna::CodeGenerateVisitor::Visit(Terminator *, void *)");
    }
    if (iVar3 + 1 != iVar1) {
      __assert_fail("register_id + 1 == end_register",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                    ,0x4c6,"virtual void luna::CodeGenerateVisitor::Visit(Terminator *, void *)");
    }
    if (*(int *)(in_RSI + 0x2c) == 1) {
      Function::AddConstString
                ((Function *)
                 CONCAT44(in_stack_ffffffffffffff54.opcode_,in_stack_ffffffffffffff50.opcode_),
                 (String *)CONCAT44(in_stack_ffffffffffffff4c.opcode_,in_stack_ffffffffffffff48));
      Instruction::ABxCode((OpType)in_RDI,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      Function::AddInstruction
                ((Function *)CONCAT44(in_stack_ffffffffffffff4c.opcode_,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff54,(int)((ulong)in_RDI >> 0x20));
    }
    else if (*(int *)(in_RSI + 0x2c) == 3) {
      pLVar2 = SearchLocalName(in_RDI,(String *)
                                      CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
      ;
      if (pLVar2 == (LocalNameInfo *)0x0) {
        __assert_fail("local",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                      ,0x4d0,"virtual void luna::CodeGenerateVisitor::Visit(Terminator *, void *)");
      }
      Instruction::ABCode((OpType)in_RDI,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      Function::AddInstruction
                ((Function *)CONCAT44(in_stack_ffffffffffffff4c.opcode_,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff54,(int)((ulong)in_RDI >> 0x20));
    }
    else if (*(int *)(in_RSI + 0x2c) == 2) {
      PrepareUpvalue(_instruction_6,_bvalue);
      Instruction::ABCode((OpType)in_RDI,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      Function::AddInstruction
                ((Function *)CONCAT44(in_stack_ffffffffffffff4c.opcode_,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff54,(int)((ulong)in_RDI >> 0x20));
    }
  }
  else if (((*(int *)(in_RSI + 0x28) != 1) || (iVar1 == -1)) || (iVar3 < iVar1)) {
    if ((*(int *)(in_RSI + 0x20) == 0x117) || (*(int *)(in_RSI + 0x20) == 0x116)) {
      if (*(int *)(in_RSI + 0x20) == 0x117) {
        Function::AddConstNumber
                  ((Function *)
                   CONCAT44(in_stack_ffffffffffffff54.opcode_,in_stack_ffffffffffffff50.opcode_),
                   (double)CONCAT44(in_stack_ffffffffffffff4c.opcode_,in_stack_ffffffffffffff48));
      }
      else {
        Function::AddConstString
                  ((Function *)
                   CONCAT44(in_stack_ffffffffffffff54.opcode_,in_stack_ffffffffffffff50.opcode_),
                   (String *)CONCAT44(in_stack_ffffffffffffff4c.opcode_,in_stack_ffffffffffffff48));
      }
      Instruction::ABxCode((OpType)in_RDI,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      iVar3 = (int)((ulong)in_RDI >> 0x20);
      Function::AddInstruction
                ((Function *)CONCAT44(in_stack_ffffffffffffff4c.opcode_,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff54,iVar3);
    }
    else if (*(int *)(in_RSI + 0x20) == 0x115) {
      if (*(int *)(in_RSI + 0x2c) == 1) {
        Function::AddConstString
                  ((Function *)
                   CONCAT44(in_stack_ffffffffffffff54.opcode_,in_stack_ffffffffffffff50.opcode_),
                   (String *)CONCAT44(in_stack_ffffffffffffff4c.opcode_,in_stack_ffffffffffffff48));
        Instruction::ABxCode((OpType)in_RDI,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
        iVar3 = (int)((ulong)in_RDI >> 0x20);
        Function::AddInstruction
                  ((Function *)CONCAT44(in_stack_ffffffffffffff4c.opcode_,in_stack_ffffffffffffff48)
                   ,in_stack_ffffffffffffff54,iVar3);
      }
      else if (*(int *)(in_RSI + 0x2c) == 3) {
        pLVar2 = SearchLocalName(in_RDI,(String *)
                                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38
                                                ));
        if (pLVar2 == (LocalNameInfo *)0x0) {
          __assert_fail("local",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                        ,0x4fb,"virtual void luna::CodeGenerateVisitor::Visit(Terminator *, void *)"
                       );
        }
        Instruction::ABCode((OpType)in_RDI,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
        iVar3 = (int)((ulong)in_RDI >> 0x20);
        Function::AddInstruction
                  ((Function *)CONCAT44(in_stack_ffffffffffffff4c.opcode_,in_stack_ffffffffffffff48)
                   ,in_stack_ffffffffffffff54,iVar3);
      }
      else {
        if (*(int *)(in_RSI + 0x2c) == 2) {
          PrepareUpvalue(_instruction_6,_bvalue);
          Instruction::ABCode((OpType)in_RDI,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
          Function::AddInstruction
                    ((Function *)
                     CONCAT44(in_stack_ffffffffffffff4c.opcode_,in_stack_ffffffffffffff48),
                     in_stack_ffffffffffffff54,(int)((ulong)in_RDI >> 0x20));
        }
        iVar3 = (int)((ulong)in_RDI >> 0x20);
      }
    }
    else {
      op = (OpType)in_RDI;
      if ((*(int *)(in_RSI + 0x20) == 0x112) || (*(int *)(in_RSI + 0x20) == 0x106)) {
        Instruction::ABCode(op,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
        iVar3 = (int)((ulong)in_RDI >> 0x20);
        Function::AddInstruction
                  ((Function *)CONCAT44(in_stack_ffffffffffffff4c.opcode_,in_stack_ffffffffffffff48)
                   ,in_stack_ffffffffffffff54,iVar3);
      }
      else if (*(int *)(in_RSI + 0x20) == 0x10c) {
        Instruction::ACode(op,in_stack_ffffffffffffff3c);
        iVar3 = (int)((ulong)in_RDI >> 0x20);
        Function::AddInstruction
                  ((Function *)CONCAT44(in_stack_ffffffffffffff4c.opcode_,in_stack_ffffffffffffff48)
                   ,in_stack_ffffffffffffff54,iVar3);
      }
      else {
        if (*(int *)(in_RSI + 0x20) == 0x11d) {
          if (iVar1 == -1) {
            in_stack_ffffffffffffff54.opcode_ = 0xffffffff;
          }
          else {
            in_stack_ffffffffffffff54.opcode_ = iVar1 - iVar3;
          }
          in_stack_ffffffffffffff4c =
               Instruction::AsBxCode(op,in_stack_ffffffffffffff54.opcode_,in_stack_ffffffffffffff38)
          ;
          in_stack_ffffffffffffff50 = in_stack_ffffffffffffff4c;
          Function::AddInstruction
                    ((Function *)
                     CONCAT44(in_stack_ffffffffffffff4c.opcode_,in_stack_ffffffffffffff48),
                     in_stack_ffffffffffffff54,(int)((ulong)in_RDI >> 0x20));
        }
        iVar3 = (int)((ulong)in_RDI >> 0x20);
      }
    }
    FillRemainRegisterNil
              ((CodeGenerateVisitor *)
               CONCAT44(in_stack_ffffffffffffff54.opcode_,in_stack_ffffffffffffff50.opcode_),
               in_stack_ffffffffffffff4c.opcode_,in_stack_ffffffffffffff48,iVar3);
  }
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(Terminator *term, void *data)
    {
        auto exp_var_data = static_cast<ExpVarData *>(data);
        auto register_id = exp_var_data->start_register_;
        auto end_register = exp_var_data->end_register_;
        auto function = GetCurrentFunction();

        // Generate code for SemanticOp_Write
        if (term->semantic_ == SemanticOp_Write)
        {
            assert(term->token_.token_ == Token_Id);
            assert(register_id + 1 == end_register);
            if (term->scoping_ == LexicalScoping_Global)
            {
                auto index = function->AddConstString(term->token_.str_);
                auto instruction = Instruction::ABxCode(OpType_SetGlobal, register_id, index);
                function->AddInstruction(instruction, term->token_.line_);
            }
            else if (term->scoping_ == LexicalScoping_Local)
            {
                auto local = SearchLocalName(term->token_.str_);
                assert(local);
                auto instruction = Instruction::ABCode(OpType_Move, local->register_id_, register_id);
                function->AddInstruction(instruction, term->token_.line_);
            }
            else if (term->scoping_ == LexicalScoping_Upvalue)
            {
                auto index = PrepareUpvalue(term->token_.str_);
                auto instruction = Instruction::ABCode(OpType_SetUpvalue, register_id, index);
                function->AddInstruction(instruction, term->token_.line_);
            }
            return ;
        }

        // Generate code for SemanticOp_Read
        // Just return when term is SemanticOp_Read and no registers to fill
        if (term->semantic_ == SemanticOp_Read &&
            end_register != EXP_VALUE_COUNT_ANY && register_id >= end_register)
            return ;

        if (term->token_.token_ == Token_Number || term->token_.token_ == Token_String)
        {
            // Load const to register
            auto index = 0;
            if (term->token_.token_ == Token_Number)
                index = function->AddConstNumber(term->token_.number_);
            else
                index = function->AddConstString(term->token_.str_);
            auto instruction = Instruction::ABxCode(OpType_LoadConst, register_id++, index);
            function->AddInstruction(instruction, term->token_.line_);
        }
        else if (term->token_.token_ == Token_Id)
        {
            if (term->scoping_ == LexicalScoping_Global)
            {
                // Get value from global table by key index
                auto index = function->AddConstString(term->token_.str_);
                auto instruction = Instruction::ABxCode(OpType_GetGlobal, register_id++, index);
                function->AddInstruction(instruction, term->token_.line_);
            }
            else if (term->scoping_ == LexicalScoping_Local)
            {
                // Load local variable value to dst register
                auto local = SearchLocalName(term->token_.str_);
                assert(local);
                auto instruction = Instruction::ABCode(OpType_Move, register_id++, local->register_id_);
                function->AddInstruction(instruction, term->token_.line_);
            }
            else if (term->scoping_ == LexicalScoping_Upvalue)
            {
                // Get upvalue index
                auto index = PrepareUpvalue(term->token_.str_);
                auto instruction = Instruction::ABCode(OpType_GetUpvalue, register_id++, index);
                function->AddInstruction(instruction, term->token_.line_);
            }
        }
        else if (term->token_.token_ == Token_True || term->token_.token_ == Token_False)
        {
            auto bvalue = term->token_.token_ == Token_True ? 1 : 0;
            auto instruction = Instruction::ABCode(OpType_LoadBool, register_id++, bvalue);
            function->AddInstruction(instruction, term->token_.line_);
        }
        else if (term->token_.token_ == Token_Nil)
        {
            auto instruction = Instruction::ACode(OpType_LoadNil, register_id++);
            function->AddInstruction(instruction, term->token_.line_);
        }
        else if (term->token_.token_ == Token_VarArg)
        {
            // Copy vararg to registers which start from register_id
            auto expect_results = end_register == EXP_VALUE_COUNT_ANY ?
                EXP_VALUE_COUNT_ANY : end_register - register_id;
            auto instruction = Instruction::AsBxCode(OpType_VarArg, register_id, expect_results);
            function->AddInstruction(instruction, term->token_.line_);

            // All registers will be filled when executing, so do not
            // fill nil to remain registers
            register_id = end_register;
        }

        FillRemainRegisterNil(register_id, end_register, term->token_.line_);
    }